

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type time_plain<trng::mrg3>(mrg3 *r)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  string res;
  string local_58;
  double local_38;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  iVar2 = 0;
  lVar6 = 0x1000000;
  iVar4 = (r->S).r[0];
  iVar3 = (r->S).r[1];
  iVar7 = (r->S).r[2];
  do {
    iVar5 = iVar3;
    iVar3 = iVar4;
    uVar8 = (long)iVar7 * (long)(r->P).a[2] +
            (long)iVar5 * (long)(r->P).a[1] + (long)iVar3 * (long)(r->P).a[0];
    uVar9 = (uVar8 >> 0x1f) + (uVar8 & 0x7fffffff);
    uVar8 = uVar9 - 0xfffffffe;
    if (uVar9 < 0xfffffffe) {
      uVar8 = uVar9;
    }
    iVar4 = (int)uVar8 + -0x7fffffff;
    if (uVar8 < 0x7fffffff) {
      iVar4 = (int)uVar8;
    }
    iVar2 = iVar2 + iVar4;
    lVar6 = lVar6 + -1;
    iVar7 = iVar5;
  } while (lVar6 != 0);
  (r->S).r[0] = iVar4;
  (r->S).r[1] = iVar3;
  (r->S).r[2] = iVar5;
  lVar6 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar6 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar2;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}